

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O3

int arkRootFree(void *arkode_mem)

{
  long lVar1;
  int iVar2;
  void *__ptr;
  undefined1 auVar3 [16];
  
  if (arkode_mem == (void *)0x0) {
    iVar2 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0x121,"arkRootFree",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else {
    __ptr = *(void **)((long)arkode_mem + 0x3d8);
    iVar2 = 0;
    if (__ptr != (void *)0x0) {
      if (0 < *(int *)((long)__ptr + 8)) {
        free(*(void **)((long)__ptr + 0x38));
        lVar1 = *(long *)((long)arkode_mem + 0x3d8);
        *(undefined8 *)(lVar1 + 0x38) = 0;
        free(*(void **)(lVar1 + 0x40));
        lVar1 = *(long *)((long)arkode_mem + 0x3d8);
        *(undefined8 *)(lVar1 + 0x40) = 0;
        free(*(void **)(lVar1 + 0x48));
        lVar1 = *(long *)((long)arkode_mem + 0x3d8);
        *(undefined8 *)(lVar1 + 0x48) = 0;
        free(*(void **)(lVar1 + 0x10));
        lVar1 = *(long *)((long)arkode_mem + 0x3d8);
        *(undefined8 *)(lVar1 + 0x10) = 0;
        free(*(void **)(lVar1 + 0x18));
        lVar1 = *(long *)((long)arkode_mem + 0x3d8);
        *(undefined8 *)(lVar1 + 0x18) = 0;
        free(*(void **)(lVar1 + 0x70));
        __ptr = *(void **)((long)arkode_mem + 0x3d8);
        *(undefined8 *)((long)__ptr + 0x70) = 0;
        lVar1 = (long)*(int *)((long)__ptr + 8) * 3;
        auVar3._8_4_ = (int)lVar1;
        auVar3._0_8_ = lVar1;
        auVar3._12_4_ = (int)((ulong)lVar1 >> 0x20);
        *(long *)((long)arkode_mem + 0x368) =
             *(long *)((long)arkode_mem + 0x368) + (long)*(int *)((long)__ptr + 8) * -3;
        *(long *)((long)arkode_mem + 0x370) = *(long *)((long)arkode_mem + 0x370) - auVar3._8_8_;
      }
      free(__ptr);
      *(long *)((long)arkode_mem + 0x368) = *(long *)((long)arkode_mem + 0x368) + -5;
      *(long *)((long)arkode_mem + 0x370) = *(long *)((long)arkode_mem + 0x370) + -0xc;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int arkRootFree(void* arkode_mem)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  if (ark_mem->root_mem != NULL)
  {
    if (ark_mem->root_mem->nrtfn > 0)
    {
      free(ark_mem->root_mem->glo);
      ark_mem->root_mem->glo = NULL;
      free(ark_mem->root_mem->ghi);
      ark_mem->root_mem->ghi = NULL;
      free(ark_mem->root_mem->grout);
      ark_mem->root_mem->grout = NULL;
      free(ark_mem->root_mem->iroots);
      ark_mem->root_mem->iroots = NULL;
      free(ark_mem->root_mem->rootdir);
      ark_mem->root_mem->rootdir = NULL;
      free(ark_mem->root_mem->gactive);
      ark_mem->root_mem->gactive = NULL;
      ark_mem->lrw -= 3 * ark_mem->root_mem->nrtfn;
      ark_mem->liw -= 3 * ark_mem->root_mem->nrtfn;
    }
    free(ark_mem->root_mem);
    ark_mem->lrw -= ARK_ROOT_LRW;
    ark_mem->liw -= ARK_ROOT_LIW;
  }
  return (ARK_SUCCESS);
}